

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O0

void WebRtcIsac_InitMasking(MaskFiltstr *maskdata)

{
  int local_14;
  int k;
  MaskFiltstr *maskdata_local;
  
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    maskdata->DataBufferLo[local_14] = 0.0;
    maskdata->DataBufferHi[local_14] = 0.0;
  }
  for (local_14 = 0; local_14 < 0xd; local_14 = local_14 + 1) {
    maskdata->CorrBufLo[local_14] = 0.0;
    maskdata->PreStateLoF[local_14] = 0.0;
    maskdata->PreStateLoG[local_14] = 0.0;
    maskdata->PostStateLoF[local_14] = 0.0;
    maskdata->PostStateLoG[local_14] = 0.0;
  }
  for (local_14 = 0; local_14 < 7; local_14 = local_14 + 1) {
    maskdata->CorrBufHi[local_14] = 0.0;
    maskdata->PreStateHiF[local_14] = 0.0;
    maskdata->PreStateHiG[local_14] = 0.0;
    maskdata->PostStateHiF[local_14] = 0.0;
    maskdata->PostStateHiG[local_14] = 0.0;
  }
  maskdata->OldEnergy = 10.0;
  return;
}

Assistant:

void WebRtcIsac_InitMasking(MaskFiltstr *maskdata) {

  int k;

  for (k = 0; k < WINLEN; k++) {
    maskdata->DataBufferLo[k] = 0.0;
    maskdata->DataBufferHi[k] = 0.0;
  }
  for (k = 0; k < ORDERLO+1; k++) {
    maskdata->CorrBufLo[k] = 0.0;
    maskdata->PreStateLoF[k] = 0.0;
    maskdata->PreStateLoG[k] = 0.0;
    maskdata->PostStateLoF[k] = 0.0;
    maskdata->PostStateLoG[k] = 0.0;
  }
  for (k = 0; k < ORDERHI+1; k++) {
    maskdata->CorrBufHi[k] = 0.0;
    maskdata->PreStateHiF[k] = 0.0;
    maskdata->PreStateHiG[k] = 0.0;
    maskdata->PostStateHiF[k] = 0.0;
    maskdata->PostStateHiG[k] = 0.0;
  }

  maskdata->OldEnergy = 10.0;
  return;
}